

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::useMagnetometerMeasurements
          (AttitudeQuaternionEKF *this,bool use_magnetometer_measurements)

{
  double orientation_var;
  double ang_vel_var;
  double gyro_bias_var;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  pointer peVar6;
  double *pdVar7;
  undefined8 uVar8;
  MatrixDynSize P;
  VectorDynSize x;
  Span<double,__1L> x_span;
  Span<double,__1L> P_span;
  MatrixDynSize local_88 [40];
  VectorDynSize local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  Span<double,__1L> local_30;
  
  bVar1 = true;
  if ((this->m_params_qekf).use_magnetometer_measurements != use_magnetometer_measurements) {
    iDynTree::VectorDynSize::VectorDynSize(local_60,&this->m_x);
    uVar4 = iDynTree::VectorDynSize::size();
    uVar5 = iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::MatrixDynSize(local_88,uVar4,uVar5);
    peVar6 = (pointer)iDynTree::MatrixDynSize::data();
    local_30.storage_.super_extent_type<_1L>.size_ = iDynTree::MatrixDynSize::capacity();
    local_30.storage_.data_ = peVar6;
    bVar1 = DiscreteExtendedKalmanFilterHelper::ekfGetStateCovariance
                      (&this->super_DiscreteExtendedKalmanFilterHelper,&local_30);
    if (bVar1) {
      pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_88,0);
      orientation_var = *pdVar7;
      pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_88,4);
      ang_vel_var = *pdVar7;
      pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_88,7);
      gyro_bias_var = *pdVar7;
      (this->m_params_qekf).use_magnetometer_measurements = use_magnetometer_measurements;
      DiscreteExtendedKalmanFilterHelper::ekfReset(&this->super_DiscreteExtendedKalmanFilterHelper);
      bVar2 = initializeFilter(this);
      uVar8 = iDynTree::VectorDynSize::data();
      local_40 = iDynTree::VectorDynSize::size();
      local_38 = uVar8;
      iVar3 = (*(this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator[0xb])(this);
      bVar1 = setInitialStateCovariance(this,orientation_var,ang_vel_var,gyro_bias_var);
      bVar1 = (bool)(bVar2 & (byte)iVar3 & bVar1);
    }
    else {
      bVar1 = false;
    }
    iDynTree::MatrixDynSize::~MatrixDynSize(local_88);
    iDynTree::VectorDynSize::~VectorDynSize(local_60);
  }
  return bVar1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::useMagnetometerMeasurements(bool use_magnetometer_measurements)
{
    if (use_magnetometer_measurements == m_params_qekf.use_magnetometer_measurements)
    {
        return true;
    }

    // store current state estimate and variance
    iDynTree::VectorDynSize x(m_x);
    iDynTree::MatrixDynSize P(m_x.size(), m_x.size());
    iDynTree::Span<double> P_span(P.data(), P.capacity());
    if (!ekfGetStateCovariance(P_span))
    {
        return false;
    }

    // get variances
    double orientation_var{P(0,0)};
    double ang_vel_var{P(4,4)};
    double gyro_bias_var{P(7,7)};

    m_params_qekf.use_magnetometer_measurements = use_magnetometer_measurements;
    ekfReset();

    bool ok = initializeFilter();
    iDynTree::Span<double> x_span(x.data(), x.size());
    ok = setInternalState(x_span) && ok;
    ok = setInitialStateCovariance(orientation_var, ang_vel_var, gyro_bias_var) && ok;
    return ok;
}